

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.cpp
# Opt level: O1

void __thiscall MinVR::VRMain::synchronizeAndProcessEvents(VRMain *this)

{
  ulong *puVar1;
  long *plVar2;
  _Base_ptr *pp_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Rb_tree_header *p_Var5;
  pointer pcVar6;
  VRNetInterface *pVVar7;
  VREventHandler *pVVar8;
  double dVar9;
  undefined8 *puVar10;
  pointer ppVVar11;
  pointer ppVVar12;
  runtime_error *this_00;
  _Base_ptr p_Var13;
  undefined8 uVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  VRDataIndex frameStartEvent;
  string local_290;
  _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
  local_270;
  _Base_ptr *local_240;
  long local_238;
  _Base_ptr local_230 [2];
  undefined1 local_220 [32];
  _Base_ptr p_Stack_200;
  size_t local_1f8;
  _Base_ptr *local_188;
  _Rb_tree_node_base local_180 [4];
  _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
  local_f0;
  VRDataIndex local_c0;
  
  if (this->_frame != 0) goto LAB_0011cf8c;
  pp_Var3 = &local_270._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_270._M_impl._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"\n\n==== ","");
  paVar4 = &local_290.field_2;
  local_290._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"RUNNING MINVR MAINLOOP","");
  p_Var15 = (_Base_ptr)
            (local_290._M_string_length +
            CONCAT44(local_270._M_impl.super__Rb_tree_header._M_header._4_4_,
                     local_270._M_impl.super__Rb_tree_header._M_header._M_color));
  p_Var13 = (_Base_ptr)0xf;
  if ((_Base_ptr *)local_270._M_impl._0_8_ != pp_Var3) {
    p_Var13 = local_270._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  if (p_Var13 < p_Var15) {
    uVar14 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar4) {
      uVar14 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < p_Var15) goto LAB_0011cda7;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,local_270._M_impl._0_8_)
    ;
  }
  else {
LAB_0011cda7:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_290._M_dataplus._M_p);
  }
  local_220._0_8_ = local_220 + 0x10;
  puVar1 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar1) {
    local_220._16_8_ = *puVar1;
    local_220._24_8_ = puVar10[3];
  }
  else {
    local_220._16_8_ = *puVar1;
    local_220._0_8_ = (ulong *)*puVar10;
  }
  local_220._8_8_ = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240," ====\n","");
  p_Var15 = (_Base_ptr)0xf;
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    p_Var15 = (_Base_ptr)local_220._16_8_;
  }
  if (p_Var15 < (_Base_ptr)(local_238 + local_220._8_8_)) {
    p_Var15 = (_Base_ptr)0xf;
    if (local_240 != local_230) {
      p_Var15 = local_230[0];
    }
    if (p_Var15 < (_Base_ptr)(local_238 + local_220._8_8_)) goto LAB_0011ce7e;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,local_220._0_8_);
  }
  else {
LAB_0011ce7e:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append(local_220,(ulong)local_240);
  }
  local_188 = &local_180[0]._M_parent;
  plVar2 = puVar10 + 2;
  if ((_Base_ptr *)*puVar10 == (_Base_ptr *)plVar2) {
    local_180[0]._M_parent = (_Base_ptr)*plVar2;
    local_180[0]._M_left = (_Base_ptr)puVar10[3];
  }
  else {
    local_180[0]._M_parent = (_Base_ptr)*plVar2;
    local_188 = (_Base_ptr *)*puVar10;
  }
  local_180[0]._0_8_ = puVar10[1];
  *puVar10 = plVar2;
  puVar10[1] = 0;
  *(undefined1 *)plVar2 = 0;
  if (local_240 != local_230) {
    operator_delete(local_240,(ulong)((long)&local_230[0]->_M_color + 1));
  }
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar4) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)local_270._M_impl._0_8_ != pp_Var3) {
    operator_delete((void *)local_270._M_impl._0_8_,
                    (ulong)((long)&(local_270._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  std::ostream::write((char *)&std::cout,(long)local_188);
  if (local_188 != &local_180[0]._M_parent) {
    operator_delete(local_188,(ulong)((long)&(local_180[0]._M_parent)->_M_color + 1));
  }
LAB_0011cf8c:
  if (this->_initialized != false) {
    p_Var5 = &local_270._M_impl.super__Rb_tree_header;
    local_270._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_270._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_270._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar6 = local_220 + 0x10;
    local_270._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
    local_270._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
    local_220._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"FrameStart","");
    dVar9 = VRSystem::getTime(false);
    VRAnalogEvent::createValidDataIndex((VRDataIndex *)&local_188,(string *)local_220,(float)dVar9);
    if ((pointer)local_220._0_8_ != pcVar6) {
      operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
    }
    local_220._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"AnalogValue","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"ElapsedSeconds","");
    VRDataIndex::linkNode((VRDataIndex *)&local_188,(string *)local_220,&local_290,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_220._0_8_ != pcVar6) {
      operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
    }
    VRDataIndex::VRDataIndex(&local_c0,(VRDataIndex *)&local_188);
    VRDataQueue::push((VRDataQueue *)&local_270,&local_c0);
    VRDataIndex::~VRDataIndex(&local_c0);
    ppVVar11 = (this->_inputDevices).
               super__Vector_base<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((this->_inputDevices).
        super__Vector_base<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppVVar11) {
      uVar16 = 0;
      do {
        (*ppVVar11[uVar16]->_vptr_VRInputDevice[2])(ppVVar11[uVar16],&local_270);
        uVar16 = uVar16 + 1;
        ppVVar11 = (this->_inputDevices).
                   super__Vector_base<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar16 < (ulong)((long)(this->_inputDevices).
                                      super__Vector_base<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar11 >>
                               3));
    }
    pVVar7 = this->_net;
    if (pVVar7 != (VRNetInterface *)0x0) {
      std::
      _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
      ::_Rb_tree(&local_f0,&local_270);
      (**pVVar7->_vptr_VRNetInterface)(local_220,pVVar7,&local_f0);
      std::
      _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
      ::clear(&local_270);
      if ((_Base_ptr)local_220._16_8_ != (_Base_ptr)0x0) {
        local_270._M_impl.super__Rb_tree_header._M_header._M_color = local_220._8_4_;
        local_270._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_220._16_8_;
        local_270._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_220._24_8_;
        local_270._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_200;
        *(_Rb_tree_header **)(local_220._16_8_ + 8) = p_Var5;
        local_270._M_impl.super__Rb_tree_header._M_node_count = local_1f8;
        local_220._16_8_ = (_Base_ptr)0x0;
        local_1f8 = 0;
        local_220._24_8_ = (_Base_ptr)(local_220 + 8);
        p_Stack_200 = (_Base_ptr)(local_220 + 8);
      }
      std::
      _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
                   *)local_220);
      std::
      _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
      ::~_Rb_tree(&local_f0);
    }
    while (local_270._M_impl.super__Rb_tree_header._M_node_count != 0) {
      ppVVar12 = (this->_eventHandlers).
                 super__Vector_base<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((this->_eventHandlers).
          super__Vector_base<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppVVar12) {
        uVar16 = 0;
        do {
          pVVar8 = ppVVar12[uVar16];
          VRDataQueue::getFirst((VRDataIndex *)local_220,(VRDataQueue *)&local_270);
          (**pVVar8->_vptr_VREventHandler)(pVVar8,(VRDataIndex *)local_220);
          VRDataIndex::~VRDataIndex((VRDataIndex *)local_220);
          uVar16 = uVar16 + 1;
          ppVVar12 = (this->_eventHandlers).
                     super__Vector_base<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar16 < (ulong)((long)(this->_eventHandlers).
                                        super__Vector_base<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar12
                                 >> 3));
      }
      VRDataQueue::pop((VRDataQueue *)&local_270);
    }
    VRDataIndex::~VRDataIndex((VRDataIndex *)&local_188);
    std::
    _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
    ::~_Rb_tree(&local_270);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"VRMain not initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
VRMain::synchronizeAndProcessEvents() {

  if (_frame == 0) {
    VRLOG_H1("RUNNING MINVR MAINLOOP");
  }

	if (!_initialized) {
		throw std::runtime_error("VRMain not initialized.");
	}

  VRDataQueue eventQueue;

  // Add a standard "FrameStart" event at the beginning of each frame
  VRDataIndex frameStartEvent =
      VRAnalogEvent::createValidDataIndex("FrameStart", (float)VRSystem::getTime());
  // by default the data will be placed in a field called "AnalogValue".  The
  // next line is not strictly necessary, but it demonstrates how to add an
  // entry to the index with a more descriptive name for event's data payload
  // additional entries could also be added here, for example, might be useful
  // to include delta time since last frame and even the current framerate.
  // Adding more fields is fine as long as the VRSystem::getTime() remains the
  // default data stored in the AnalogValue field.
  frameStartEvent.linkNode("AnalogValue", "ElapsedSeconds");
  eventQueue.push(frameStartEvent);

  for (int f = 0; f < _inputDevices.size(); f++) {
    _inputDevices[f]->appendNewInputEventsSinceLastCall(&eventQueue);
  }

	// SYNCHRONIZATION POINT #1: When this function returns, we know
	// that all MinVR nodes have the same list of input events generated
	// since the last call to synchronizeAndProcessEvents(..).  So,
	// every node will process the same set of input events this frame.
  if (_net != NULL) {
    eventQueue = _net->syncEventDataAcrossAllNodes(eventQueue);
  }

  while (eventQueue.notEmpty()) {
    // Unpack the next item from the queue and invoke the user's
    // callback on it.
    for (int f = 0; f < _eventHandlers.size(); f++) {
      _eventHandlers[f]->onVREvent(eventQueue.getFirst());
    }

    // Remove the item from the queue.
    eventQueue.pop();
  }

  // At this point the eventQueue should be empty with all its events
  // distributed to the user callback.  Our job here is done and we can
  // safely get out.
}